

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

void __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
~MemPool(MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this)

{
  MemSegment *pMVar1;
  MemSegment *ptr;
  
  ptr = this->m_segList;
  while (ptr != (MemSegment *)0x0) {
    pMVar1 = ptr->m_next;
    PtrAVLTree::add(&this->m_arena->m_tree,ptr,ptr->m_size);
    ptr = pMVar1;
  }
  return;
}

Assistant:

~MemPool()
    {
        MemSegment* seg = m_segList;
        while (seg)
        {
            void* ptr = seg;
            size_type size = seg->getSize ();
            seg = seg->getNext ();
            m_logger.logFreeSegment (ptr, size);
            m_arena.freeSegment (ptr, size);
        }
    }